

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int lock_trylock(LOCK lock)

{
  int iVar1;
  pthread_mutex_t *in_RDI;
  
  iVar1 = pthread_mutex_trylock(in_RDI);
  return iVar1;
}

Assistant:

int lock_trylock(LOCK lock)
{
#if defined(CONF_FAMILY_UNIX)
	return pthread_mutex_trylock((LOCKINTERNAL *)lock);
#elif defined(CONF_FAMILY_WINDOWS)
	return !TryEnterCriticalSection((LPCRITICAL_SECTION)lock);
#else
	#error not implemented on this platform
#endif
}